

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

size_type __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::
calculateGrowth(SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                *this,size_type newSize)

{
  size_type doubled;
  size_type max;
  size_type newSize_local;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *this_local;
  
  this_local = (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *)
               max_size(this);
  if ((this->cap <= (long)this_local - this->cap) &&
     (this_local = (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                    *)(this->cap << 1), this_local < newSize)) {
    this_local = (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter> *)
                 newSize;
  }
  return (size_type)this_local;
}

Assistant:

constexpr size_type calculateGrowth(size_type newSize) const {
        const auto max = max_size();
        if (cap > max - cap)
            return max;

        const size_type doubled = cap * 2;
        if (doubled < newSize)
            return newSize;

        return doubled;
    }